

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTFusionRTQF.cpp
# Opt level: O0

void __thiscall RTFusionRTQF::update(RTFusionRTQF *this)

{
  RTFLOAT RVar1;
  float fVar2;
  undefined4 extraout_XMM0_Db;
  double dVar3;
  double dVar4;
  RTFLOAT cosPowerTheta;
  RTFLOAT sinPowerTheta;
  RTFLOAT theta;
  RTQuaternion local_20;
  RTFusionRTQF *local_10;
  RTFusionRTQF *this_local;
  
  if ((((this->super_RTFusion).m_enableCompass & 1U) != 0) ||
     (((this->super_RTFusion).m_enableAccel & 1U) != 0)) {
    local_10 = this;
    _sinPowerTheta = RTQuaternion::conjugate(&this->m_stateQ);
    local_20 = RTQuaternion::operator*
                         ((RTQuaternion *)&sinPowerTheta,&(this->super_RTFusion).m_measuredQPose);
    RTQuaternion::operator=(&(this->super_RTFusion).m_rotationDelta,&local_20);
    RTQuaternion::normalize(&(this->super_RTFusion).m_rotationDelta);
    RVar1 = RTQuaternion::scalar(&(this->super_RTFusion).m_rotationDelta);
    dVar3 = std::acos((double)CONCAT44(extraout_XMM0_Db,RVar1));
    dVar4 = std::sin((double)(ulong)(uint)(SUB84(dVar3,0) * (this->super_RTFusion).m_slerpPower));
    fVar2 = SUB84(dVar4,0);
    dVar3 = std::cos((double)(ulong)(uint)(SUB84(dVar3,0) * (this->super_RTFusion).m_slerpPower));
    RVar1 = RTQuaternion::x(&(this->super_RTFusion).m_rotationDelta);
    RTVector3::setX(&(this->super_RTFusion).m_rotationUnitVector,RVar1);
    RVar1 = RTQuaternion::y(&(this->super_RTFusion).m_rotationDelta);
    RTVector3::setY(&(this->super_RTFusion).m_rotationUnitVector,RVar1);
    RVar1 = RTQuaternion::z(&(this->super_RTFusion).m_rotationDelta);
    RTVector3::setZ(&(this->super_RTFusion).m_rotationUnitVector,RVar1);
    RTVector3::normalize(&(this->super_RTFusion).m_rotationUnitVector);
    RTQuaternion::setScalar(&(this->super_RTFusion).m_rotationPower,SUB84(dVar3,0));
    RVar1 = RTVector3::x(&(this->super_RTFusion).m_rotationUnitVector);
    RTQuaternion::setX(&(this->super_RTFusion).m_rotationPower,fVar2 * RVar1);
    RVar1 = RTVector3::y(&(this->super_RTFusion).m_rotationUnitVector);
    RTQuaternion::setY(&(this->super_RTFusion).m_rotationPower,fVar2 * RVar1);
    RVar1 = RTVector3::z(&(this->super_RTFusion).m_rotationUnitVector);
    RTQuaternion::setZ(&(this->super_RTFusion).m_rotationPower,fVar2 * RVar1);
    RTQuaternion::normalize(&(this->super_RTFusion).m_rotationPower);
    RTQuaternion::operator*=(&this->m_stateQ,&(this->super_RTFusion).m_rotationPower);
    RTQuaternion::normalize(&this->m_stateQ);
  }
  return;
}

Assistant:

void RTFusionRTQF::update()
{
    if (m_enableCompass || m_enableAccel) {

        // calculate rotation delta

        m_rotationDelta = m_stateQ.conjugate() * m_measuredQPose;
        m_rotationDelta.normalize();

        // take it to the power (0 to 1) to give the desired amount of correction

        RTFLOAT theta = acos(m_rotationDelta.scalar());

        RTFLOAT sinPowerTheta = sin(theta * m_slerpPower);
        RTFLOAT cosPowerTheta = cos(theta * m_slerpPower);

        m_rotationUnitVector.setX(m_rotationDelta.x());
        m_rotationUnitVector.setY(m_rotationDelta.y());
        m_rotationUnitVector.setZ(m_rotationDelta.z());
        m_rotationUnitVector.normalize();

        m_rotationPower.setScalar(cosPowerTheta);
        m_rotationPower.setX(sinPowerTheta * m_rotationUnitVector.x());
        m_rotationPower.setY(sinPowerTheta * m_rotationUnitVector.y());
        m_rotationPower.setZ(sinPowerTheta * m_rotationUnitVector.z());
        m_rotationPower.normalize();

        //  multiple this by predicted value to get result

        m_stateQ *= m_rotationPower;
        m_stateQ.normalize();
    }
}